

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O2

bool __thiscall r_exec::CSTOverlay::reduce(CSTOverlay *this,View *input,CSTOverlay **offspring)

{
  atomic_int_fast64_t *paVar1;
  P<r_exec::HLPBindingMap> *this_00;
  pointer pPVar2;
  Atom *pAVar3;
  bool simulation;
  bool bVar4;
  int iVar5;
  Pred *this_01;
  _Object *p_Var6;
  HLPBindingMap *this_02;
  CSTOverlay *pCVar7;
  pointer pcVar8;
  long lVar9;
  pointer pPVar10;
  P<r_exec::HLPBindingMap> bm;
  P<r_exec::HLPBindingMap> original_bindings;
  
  iVar5 = (*((input->super_View).object.object)->_vptr__Object[0xe])();
  if ((char)iVar5 == '\0') {
    pPVar2 = (this->inputs).
             super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar10 = (this->inputs).
                   super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pPVar10 != pPVar2;
        pPVar10 = pPVar10 + 1) {
      bm.object = pPVar10->object;
      if (bm.object == (_Object *)0x0) {
        p_Var6 = (_Object *)0x0;
      }
      else {
        LOCK();
        ((bm.object)->refCount).super___atomic_base<long>._M_i =
             ((bm.object)->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
        p_Var6 = bm.object;
      }
      if ((input->super_View).object.object == p_Var6) {
        *offspring = (CSTOverlay *)0x0;
        core::P<r_exec::_Fact>::~P((P<r_exec::_Fact> *)&bm);
        goto LAB_00176c68;
      }
      core::P<r_exec::_Fact>::~P((P<r_exec::_Fact> *)&bm);
    }
    this_01 = _Fact::get_pred((_Fact *)(input->super_View).object.object);
    if (this_01 == (Pred *)0x0) {
      p_Var6 = (input->super_View).object.object;
      simulation = false;
    }
    else {
      p_Var6 = (_Object *)Pred::get_target(this_01);
      simulation = Pred::is_simulation(this_01);
    }
    this_02 = (HLPBindingMap *)operator_new(0x40);
    HLPBindingMap::HLPBindingMap(this_02);
    LOCK();
    paVar1 = &(this_02->super_BindingMap).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    this_00 = &(this->super_HLPOverlay).bindings;
    bm.object = (_Object *)this_02;
    for (pcVar8 = (pointer)&(this->super_HLPOverlay).patterns.used_cells_head; lVar9 = pcVar8->next,
        lVar9 != -1; pcVar8 = pcVar8 + lVar9) {
      HLPBindingMap::load((HLPBindingMap *)bm.object,(HLPBindingMap *)this_00->object);
      if ((this->inputs).
          super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          (this->inputs).
          super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        BindingMap::reset_fwd_timings((BindingMap *)bm.object,(_Fact *)p_Var6);
      }
      bVar4 = BindingMap::match_fwd_strict
                        ((BindingMap *)bm.object,(_Fact *)p_Var6,
                         (_Fact *)(this->super_HLPOverlay).patterns.cells.
                                  super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar9].data.object);
      pcVar8 = (this->super_HLPOverlay).patterns.cells.
               super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (bVar4) {
        p_Var6 = pcVar8[lVar9].data.object;
        if (p_Var6 != (_Object *)0x0) {
          if ((this->super_HLPOverlay).patterns.used_cell_count == 1) {
            if ((this->super_HLPOverlay).super_Overlay.code != (Atom *)0x0) {
              update(this,(HLPBindingMap *)bm.object,(_Fact *)(input->super_View).object.object,
                     (_Fact *)p_Var6);
              inject_production(this);
              LOCK();
              (this->super_HLPOverlay).super_Overlay.invalidated.super___atomic_base<unsigned_long>.
              _M_i = 1;
              UNLOCK();
              pCVar7 = (CSTOverlay *)0x0;
              goto LAB_00176d66;
            }
            Overlay::load_code((Overlay *)this);
            original_bindings.object = this_00->object;
            if (original_bindings.object != (_Object *)0x0) {
              LOCK();
              ((original_bindings.object)->refCount).super___atomic_base<long>._M_i =
                   ((original_bindings.object)->refCount).super___atomic_base<long>._M_i + 1;
              UNLOCK();
            }
            core::P<r_exec::HLPBindingMap>::operator=(this_00,(HLPBindingMap *)bm.object);
            bVar4 = HLPOverlay::evaluate_fwd_guards(&this->super_HLPOverlay);
            if (bVar4) {
              update(this,(HLPBindingMap *)bm.object,(_Fact *)(input->super_View).object.object,
                     (_Fact *)p_Var6);
              inject_production(this);
              LOCK();
              (this->super_HLPOverlay).super_Overlay.invalidated.super___atomic_base<unsigned_long>.
              _M_i = 1;
              UNLOCK();
              *offspring = (CSTOverlay *)0x0;
              HLPOverlay::store_evidence
                        (&this->super_HLPOverlay,(_Fact *)(input->super_View).object.object,
                         this_01 != (Pred *)0x0,simulation);
            }
            else {
              pAVar3 = (this->super_HLPOverlay).super_Overlay.code;
              if (pAVar3 != (Atom *)0x0) {
                if (*(long *)(pAVar3 + -8) != 0) {
                  lVar9 = *(long *)(pAVar3 + -8) << 2;
                  do {
                    r_code::Atom::~Atom(pAVar3 + lVar9 + -4);
                    lVar9 = lVar9 + -4;
                  } while (lVar9 != 0);
                }
                operator_delete__(pAVar3 + -8);
              }
              (this->super_HLPOverlay).super_Overlay.code = (Atom *)0x0;
              *offspring = (CSTOverlay *)0x0;
            }
            core::P<r_exec::HLPBindingMap>::~P(&original_bindings);
          }
          else {
            pCVar7 = get_offspring(this,(HLPBindingMap *)bm.object,
                                   (_Fact *)(input->super_View).object.object,(_Fact *)p_Var6);
LAB_00176d66:
            *offspring = pCVar7;
            bVar4 = true;
            HLPOverlay::store_evidence
                      (&this->super_HLPOverlay,(_Fact *)(input->super_View).object.object,
                       this_01 != (Pred *)0x0,simulation);
          }
          goto LAB_00176d85;
        }
        break;
      }
    }
    *offspring = (CSTOverlay *)0x0;
    bVar4 = false;
LAB_00176d85:
    core::P<r_exec::HLPBindingMap>::~P(&bm);
  }
  else {
    *offspring = (CSTOverlay *)0x0;
LAB_00176c68:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CSTOverlay::reduce(View *input, CSTOverlay *&offspring)
{
    if (input->object->is_invalidated()) {
        offspring = nullptr;
        return false;
    }

    for (P<_Fact> currentInput : inputs) { // discard inputs that already matched.
        if (((_Fact *)input->object) == currentInput) {
            offspring = nullptr;
            return false;
        }
    }

    // uint64_t now=Now();
    // if(match_deadline==0)
    // std::cout<<Time::ToString_seconds(Now()-st)<<" "<<std::hex<<this<<std::dec<<" (0) "<<input->object->get_oid()<<std::endl;
    // else
    // std::cout<<Time::ToString_seconds(Now()-st)<<" "<<std::hex<<this<<std::dec<<" ("<<Time::ToString_seconds(match_deadline-st)<<") "<<input->object->get_oid()<<std::endl;
    _Fact *input_object;
    Pred *prediction = ((_Fact *)input->object)->get_pred();
    bool simulation;

    if (prediction) {
        input_object = prediction->get_target(); // input_object is f1 as in f0->pred->f1->object.
        simulation = prediction->is_simulation();
    } else {
        input_object = (_Fact *)input->object;
        simulation = false;
    }

    P<HLPBindingMap> bm = new HLPBindingMap();
    _Fact *bound_pattern = nullptr;
    r_code::list<P<_Fact> >::const_iterator p;

    for (p = patterns.begin(); p != patterns.end(); ++p) {
        bm->load(bindings);

        if (inputs.size() == 0) {
            bm->reset_fwd_timings(input_object);
        }

        if (bm->match_fwd_strict(input_object, *p)) {
            bound_pattern = *p;
            break;
        }
    }

    if (bound_pattern) {
        //if(match_deadline==0){
        // std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" "<<std::hex<<this<<std::dec<<" (0) ";
        //}else{
        // std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" "<<std::hex<<this<<std::dec<<" ("<<Time::ToString_seconds(match_deadline-Utils::GetTimeReference())<<") ";
        //}
        if (patterns.size() == 1) { // last match.
            if (!code) {
                load_code();
                P<HLPBindingMap> original_bindings = bindings;
                bindings = bm;

                if (evaluate_fwd_guards()) { // may update bindings; full match.
                    //std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" full match\n";
                    update(bm, (_Fact *)input->object, bound_pattern);
                    inject_production();
                    invalidate();
                    offspring = nullptr;
                    store_evidence(input->object, prediction, simulation);
                    return true;
                } else {
                    //std::cout<<" guards failed\n";
                    delete[] code;
                    code = nullptr;
                    offspring = nullptr;
                    return false;
                }
            } else { // guards already evaluated, full match.
                //std::cout<<Time::ToString_seconds(now-Utils::GetTimeReference())<<" full match\n";
                update(bm, (_Fact *)input->object, bound_pattern);
                inject_production();
                invalidate();
                offspring = nullptr;
                store_evidence(input->object, prediction, simulation);
                return true;
            }
        } else {
            //std::cout<<" match\n";
            offspring = get_offspring(bm, (_Fact *)input->object, bound_pattern);
            store_evidence(input->object, prediction, simulation);
            return true;
        }
    } else {
        //std::cout<<" no match\n";
        offspring = nullptr;
        return false;
    }
}